

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

void __thiscall MPEGPictureHeader::buildCodingExtension(MPEGPictureHeader *this)

{
  uint8_t *puVar1;
  BitStreamWriter bitWriter;
  BitStreamWriter local_38;
  
  local_38.super_BitStream.m_totalBits = 0;
  local_38.super_BitStream.m_buffer = (uint *)0x0;
  local_38.super_BitStream.m_initBuffer = (uint *)0x0;
  local_38.m_curVal = 0;
  local_38.m_bitWrited = 0;
  puVar1 = (this->super_MPEGRawDataHeader).m_data_buffer;
  BitStream::setBuffer
            (&local_38.super_BitStream,puVar1 + (this->super_MPEGRawDataHeader).m_data_buffer_len,
             puVar1 + (this->super_MPEGRawDataHeader).m_max_data_len);
  local_38.m_curVal = 0;
  local_38.m_bitWrited = 0;
  BitStreamWriter::putBits(&local_38,0x10,0);
  BitStreamWriter::putBits(&local_38,0x10,0x1b5);
  BitStreamWriter::putBits(&local_38,4,8);
  BitStreamWriter::putBits(&local_38,4,(uint)this->mpeg_f_code[0][0]);
  BitStreamWriter::putBits(&local_38,4,(uint)this->mpeg_f_code[0][1]);
  BitStreamWriter::putBits(&local_38,4,(uint)this->mpeg_f_code[1][0]);
  BitStreamWriter::putBits(&local_38,4,(uint)this->mpeg_f_code[1][1]);
  BitStreamWriter::putBits(&local_38,2,(uint)this->intra_dc_precision);
  BitStreamWriter::putBits(&local_38,2,(uint)this->picture_structure);
  BitStreamWriter::putBits(&local_38,1,(uint)this->top_field_first);
  BitStreamWriter::putBits(&local_38,1,(uint)this->frame_pred_frame_dct);
  BitStreamWriter::putBits(&local_38,1,(uint)this->concealment_motion_vectors);
  BitStreamWriter::putBits(&local_38,1,(uint)this->q_scale_type);
  BitStreamWriter::putBits(&local_38,1,(uint)this->intra_vlc_format);
  BitStreamWriter::putBits(&local_38,1,(uint)this->alternate_scan);
  BitStreamWriter::putBits(&local_38,1,(uint)this->repeat_first_field);
  BitStreamWriter::putBits(&local_38,1,(uint)this->chroma_420_type);
  BitStreamWriter::putBits(&local_38,1,(uint)this->progressive_frame);
  BitStreamWriter::putBits(&local_38,1,(uint)this->composite_display_flag);
  if (this->composite_display_flag != '\0') {
    BitStreamWriter::putBits(&local_38,1,(uint)this->v_axis);
    BitStreamWriter::putBits(&local_38,3,(uint)this->field_sequence);
    BitStreamWriter::putBits(&local_38,1,(uint)this->sub_carrier);
    BitStreamWriter::putBits(&local_38,7,(uint)this->burst_amplitude);
    BitStreamWriter::putBits(&local_38,8,(uint)this->sub_carrier_phase);
  }
  BitStreamWriter::flushBits(&local_38);
  (this->super_MPEGRawDataHeader).m_data_buffer_len =
       (((this->super_MPEGRawDataHeader).m_data_buffer_len + 1) -
       (uint)((local_38._24_8_ & 0x700000000) == 0)) +
       ((int)(local_38.m_bitWrited +
             ((int)local_38.super_BitStream.m_buffer - (int)local_38.super_BitStream.m_initBuffer) *
             8) >> 3);
  return;
}

Assistant:

void MPEGPictureHeader::buildCodingExtension()
{
    BitStreamWriter bitWriter{};
    uint8_t* bufPtr = m_data_buffer + m_data_buffer_len;
    bitWriter.setBuffer(bufPtr, bufPtr + m_max_data_len - m_data_buffer_len);

    bitWriter.putBits(16, 0);
    bitWriter.putBits(16, EXT_START_CODE);

    bitWriter.putBits(4, PICTURE_CODING_EXT);

    bitWriter.putBits(4, mpeg_f_code[0][0]);
    bitWriter.putBits(4, mpeg_f_code[0][1]);
    bitWriter.putBits(4, mpeg_f_code[1][0]);
    bitWriter.putBits(4, mpeg_f_code[1][1]);

    bitWriter.putBits(2, intra_dc_precision);

    bitWriter.putBits(2, picture_structure);
    bitWriter.putBits(1, top_field_first);
    bitWriter.putBits(1, frame_pred_frame_dct);
    bitWriter.putBits(1, concealment_motion_vectors);
    bitWriter.putBits(1, q_scale_type);
    bitWriter.putBits(1, intra_vlc_format);

    bitWriter.putBits(1, alternate_scan);
    bitWriter.putBits(1, repeat_first_field);
    bitWriter.putBits(1, chroma_420_type);
    bitWriter.putBits(1, progressive_frame);
    bitWriter.putBits(1, composite_display_flag);
    if (composite_display_flag)
    {
        bitWriter.putBits(1, v_axis);
        bitWriter.putBits(3, field_sequence);
        bitWriter.putBits(1, sub_carrier);
        bitWriter.putBits(7, burst_amplitude);
        bitWriter.putBits(8, sub_carrier_phase);
    }
    bitWriter.flushBits();
    const int bitCnt = bitWriter.getBitsCount();
    m_data_buffer_len += (bitCnt >> 3) + (bitCnt & 7 ? 1 : 0);
}